

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quick_connection.cc
# Opt level: O2

void __thiscall
QuickConnection::QuickConnection
          (QuickConnection *this,QuickCallback *quick_cb,ProcessThread *thread,UdpSocket *socket,
          uint32_t session_id,string *dst_ip,uint16_t dst_port,bool connected,AckThread *ack_thread)

{
  unique_ptr<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
  *puVar1;
  unique_ptr<quic::QuicClock,_std::default_delete<quic::QuicClock>_> *puVar2;
  QuicClock *pQVar3;
  SendAlgorithmInterface *pSVar4;
  ProcessThread *pPVar5;
  pointer __p;
  RingBuffer<QuickPacket> *this_00;
  QuicClock *this_01;
  pointer __p_00;
  RttStats *this_02;
  QuicUnackedPacketMap *this_03;
  SendAlgorithmInterface *pSVar6;
  PacingSender *this_04;
  long *plVar7;
  
  (this->super_Module)._vptr_Module = (_func_int **)&PTR_TimeUntilNextProcess_00137698;
  this->_session_id = session_id;
  std::__cxx11::string::string((string *)&this->_dst_ip,(string *)dst_ip);
  this->_dst_port = dst_port;
  this->_socket = socket;
  this->_thread = thread;
  (this->_repeating_task)._repeating_task = (RepeatingTaskBase *)0x0;
  this->_ack_thread = ack_thread;
  this->_repeating_task_interval_ms = 0x14;
  this->_server_state = connected;
  this->_expect_recv_sequence_number = 0;
  memset(this->_received_packets,0,0x80000);
  (this->_send_buf)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  (this->_send_algorithm)._M_t.
  super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
  .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl =
       (SendAlgorithmInterface *)0x0;
  (this->_pacing_sender)._M_t.
  super___uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>._M_t.
  super__Tuple_impl<0UL,_quic::PacingSender_*,_std::default_delete<quic::PacingSender>_>.
  super__Head_base<0UL,_quic::PacingSender_*,_false>._M_head_impl = (PacingSender *)0x0;
  (this->_clock)._M_t.super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>.
  _M_t.super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
  super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl = (QuicClock *)0x0;
  (this->_rtt_stats)._M_t.
  super___uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>._M_t.
  super__Tuple_impl<0UL,_quic::RttStats_*,_std::default_delete<quic::RttStats>_>.
  super__Head_base<0UL,_quic::RttStats_*,_false>._M_head_impl = (RttStats *)0x0;
  (this->_connection_stats)._M_t.
  super___uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>.
  _M_t.
  super__Tuple_impl<0UL,_quic::QuicConnectionStats_*,_std::default_delete<quic::QuicConnectionStats>_>
  .super__Head_base<0UL,_quic::QuicConnectionStats_*,_false>._M_head_impl =
       (QuicConnectionStats *)0x0;
  (this->_wait_send_packets)._M_t.
  super___uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_RingBuffer<QuickPacket>_*,_std::default_delete<RingBuffer<QuickPacket>_>_>.
  super__Head_base<0UL,_RingBuffer<QuickPacket>_*,_false>._M_head_impl =
       (RingBuffer<QuickPacket> *)0x0;
  (this->_unacked_packet_map)._M_t.
  super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
  .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl =
       (QuicUnackedPacketMap *)0x0;
  this->_sequence_number = 0;
  this->_packet_number = 0;
  (this->_packets_acked).super__Vector_base<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_packets_acked).super__Vector_base<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_packets_acked).super__Vector_base<quic::AckedPacket,_std::allocator<quic::AckedPacket>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_packets_lost).super__Vector_base<quic::LostPacket,_std::allocator<quic::LostPacket>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_packets_lost).super__Vector_base<quic::LostPacket,_std::allocator<quic::LostPacket>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_packets_lost).super__Vector_base<quic::LostPacket,_std::allocator<quic::LostPacket>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_rtt_updated = false;
  this->_quick_cb = quick_cb;
  this->_retransmission_packet_timeout_us = 1000000;
  (this->_wait_retransmission_packets).
  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->_wait_retransmission_packets;
  (this->_wait_retransmission_packets).
  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->_wait_retransmission_packets;
  (this->_wait_retransmission_packets).
  super__List_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl._M_node._M_size = 0;
  this->_wait_process_infinite = false;
  this->_total_acked_bytes = 0;
  this->_prior_total_acked_bytes = 0;
  this->_print_acked_bytes_us = 0;
  this->_recv_speed_bytes = 0;
  this->_print_time_ms = 0;
  this->_latest_received_ack_time = 0;
  this->_prior_sent_time = 0;
  this->_acked_rate = 0;
  this->_prior_receive_ack_time = 0;
  this->_need_reconnect = true;
  this->_reconnect_time = 0;
  this->_latest_send_msg_time = 0;
  this->_latest_recv_msg_time = 0;
  (this->_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_send_packets_len;
  (this->_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_send_packets_len;
  (this->_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  this->_total_send_len = 0;
  (this->_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_recv_packets_len;
  (this->_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_recv_packets_len;
  (this->_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  this->_total_recv_len = 0;
  (this->_acked_packets_len).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_acked_packets_len;
  (this->_acked_packets_len).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_acked_packets_len;
  (this->_acked_packets_len).super__List_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl._M_node._M_size = 0;
  (this->_real_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_real_send_packets_len;
  (this->_real_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_real_send_packets_len;
  (this->_real_send_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  (this->_real_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->_real_recv_packets_len;
  (this->_real_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->_real_recv_packets_len;
  (this->_real_recv_packets_len).
  super__List_base<QuickConnection::PacketInfo,_std::allocator<QuickConnection::PacketInfo>_>.
  _M_impl._M_node._M_size = 0;
  if (connected) {
    this->_need_reconnect = false;
  }
  puVar1 = &this->_send_algorithm;
  puVar2 = &this->_clock;
  AckThread::AddSession(ack_thread,this->_session_id,&this->_dst_ip,dst_port);
  __p = (pointer)operator_new__(0x800);
  std::__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_>::reset
            ((__uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char>_> *)&this->_send_buf
             ,__p);
  if (this->_server_state == false) {
    ConnectToServer(this);
  }
  this_00 = (RingBuffer<QuickPacket> *)operator_new(0x18);
  RingBuffer<QuickPacket>::RingBuffer(this_00,1000);
  std::__uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_>::
  reset((__uniq_ptr_impl<RingBuffer<QuickPacket>,_std::default_delete<RingBuffer<QuickPacket>_>_> *)
        &this->_wait_send_packets,this_00);
  this_01 = (QuicClock *)operator_new(0x18);
  ((QuicClock *)&this_01->_vptr_QuicClock)->_vptr_QuicClock = (_func_int **)0x0;
  *(undefined8 *)&this_01->is_calibrated_ = 0;
  (this_01->calibration_offset_).time_offset_ = 0;
  quic::QuicClockImpl::QuicClockImpl((QuicClockImpl *)this_01);
  pQVar3 = (puVar2->_M_t).
           super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
           super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
           super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl;
  (puVar2->_M_t).super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>._M_t.
  super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>.
  super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl = this_01;
  if (pQVar3 != (QuicClock *)0x0) {
    (*pQVar3->_vptr_QuicClock[1])();
  }
  __p_00 = (pointer)operator_new(0x30);
  (__p_00->slowstart_duration).total_elapsed_.time_offset_ = 0;
  __p_00->slowstart_count = 0;
  __p_00->bbr_num_cycles = 0;
  __p_00->bbr_num_short_cycles_for_reno_coexistence = 0;
  __p_00->num_ack_aggregation_epochs = 0;
  (__p_00->slowstart_duration).last_start_time_.time_ = 0x7fffffffffffffff;
  __p_00->bbr_exit_startup_due_to_loss = false;
  std::__uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>::
  reset((__uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>
         *)&this->_connection_stats,__p_00);
  this_02 = (RttStats *)operator_new(0x60);
  quic::RttStats::RttStats(this_02);
  std::__uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>::reset
            ((__uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_> *)
             &this->_rtt_stats,this_02);
  this_03 = (QuicUnackedPacketMap *)operator_new(0x2c0020);
  quic::QuicUnackedPacketMap::QuicUnackedPacketMap(this_03);
  std::__uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
  ::reset((__uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
           *)&this->_unacked_packet_map,this_03);
  pSVar6 = quic::SendAlgorithmInterface::Create
                     ((puVar2->_M_t).
                      super___uniq_ptr_impl<quic::QuicClock,_std::default_delete<quic::QuicClock>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_quic::QuicClock_*,_std::default_delete<quic::QuicClock>_>
                      .super__Head_base<0UL,_quic::QuicClock_*,_false>._M_head_impl,
                      (this->_rtt_stats)._M_t.
                      super___uniq_ptr_impl<quic::RttStats,_std::default_delete<quic::RttStats>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_quic::RttStats_*,_std::default_delete<quic::RttStats>_>
                      .super__Head_base<0UL,_quic::RttStats_*,_false>._M_head_impl,
                      (this->_unacked_packet_map)._M_t.
                      super___uniq_ptr_impl<quic::QuicUnackedPacketMap,_std::default_delete<quic::QuicUnackedPacketMap>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_quic::QuicUnackedPacketMap_*,_std::default_delete<quic::QuicUnackedPacketMap>_>
                      .super__Head_base<0UL,_quic::QuicUnackedPacketMap_*,_false>._M_head_impl,
                      kBBRv2,(this->_connection_stats)._M_t.
                             super___uniq_ptr_impl<quic::QuicConnectionStats,_std::default_delete<quic::QuicConnectionStats>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_quic::QuicConnectionStats_*,_std::default_delete<quic::QuicConnectionStats>_>
                             .super__Head_base<0UL,_quic::QuicConnectionStats_*,_false>._M_head_impl
                      ,0x20);
  pSVar4 = (puVar1->_M_t).
           super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
           ._M_t.
           super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
           .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl;
  (puVar1->_M_t).
  super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
  ._M_t.
  super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
  .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl = pSVar6;
  if (pSVar4 != (SendAlgorithmInterface *)0x0) {
    (*pSVar4->_vptr_SendAlgorithmInterface[1])();
  }
  this_04 = (PacingSender *)operator_new(0x40);
  quic::PacingSender::PacingSender(this_04);
  std::__uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>::reset
            ((__uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_> *)
             &this->_pacing_sender,this_04);
  quic::PacingSender::set_sender
            ((this->_pacing_sender)._M_t.
             super___uniq_ptr_impl<quic::PacingSender,_std::default_delete<quic::PacingSender>_>.
             _M_t.
             super__Tuple_impl<0UL,_quic::PacingSender_*,_std::default_delete<quic::PacingSender>_>.
             super__Head_base<0UL,_quic::PacingSender_*,_false>._M_head_impl,
             (puVar1->_M_t).
             super___uniq_ptr_impl<quic::SendAlgorithmInterface,_std::default_delete<quic::SendAlgorithmInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_quic::SendAlgorithmInterface_*,_std::default_delete<quic::SendAlgorithmInterface>_>
             .super__Head_base<0UL,_quic::SendAlgorithmInterface_*,_false>._M_head_impl);
  (*(this->_thread->super_TaskQueueBase)._vptr_TaskQueueBase[8])(this->_thread,this);
  (*(this->_thread->super_TaskQueueBase)._vptr_TaskQueueBase[7])(this->_thread,this);
  pPVar5 = this->_thread;
  plVar7 = (long *)operator_new(0x10);
  *plVar7 = (long)&PTR__QueuedTask_001376e8;
  plVar7[1] = (long)this;
  (*(pPVar5->super_TaskQueueBase)._vptr_TaskQueueBase[1])(pPVar5);
  if (plVar7 != (long *)0x0) {
    (**(code **)(*plVar7 + 8))();
  }
  return;
}

Assistant:

QuickConnection::QuickConnection(QuickCallback* quick_cb, dd::ProcessThread *thread, UdpSocket* socket, 
	uint32_t session_id, const std::string &dst_ip, uint16_t dst_port, bool connected, AckThread* ack_thread)
	: _quick_cb(quick_cb), _thread(thread), _socket(socket), _session_id(session_id), _dst_ip(dst_ip), _dst_port(dst_port), _server_state(connected)
	,_ack_thread(ack_thread)
{
	if (_server_state)
		_need_reconnect = false;
	_ack_thread->AddSession(_session_id, _dst_ip, _dst_port);
	_send_buf.reset(new uint8_t[SEND_BUF_LEN]);
	if (!_server_state)
		ConnectToServer();
	_wait_send_packets.reset(new RingBuffer<QuickPacket>(1000));
	_clock.reset(new quic::QuicClockImpl());
	_connection_stats.reset(new quic::QuicConnectionStats);
	_rtt_stats.reset(new quic::RttStats);
	_unacked_packet_map.reset(new quic::QuicUnackedPacketMap);
	_send_algorithm.reset(quic::SendAlgorithmInterface::Create(_clock.get(),
		_rtt_stats.get(),
		_unacked_packet_map.get(),
		quic::kBBRv2,
		_connection_stats.get(),
		32));

	_pacing_sender.reset(new quic::PacingSender);
	_pacing_sender->set_sender(_send_algorithm.get());

	_thread->RegisterModule(this, dd::RTC_FROM_HERE);
	_thread->WakeUp(this);

	PostTask([this] {
		_repeating_task = dd::RepeatingTaskHandle::DelayedStart(_thread->Current(), _repeating_task_interval_ms, [this] {
			if(!_server_state && _need_reconnect)
				TryReconnectServer();
			TrySendHeartbeat();
			MaybeWakeupProcess();
			PickTimeoutUnackedPackets();
			if (_clock->Now().ToDebuggingValue() - _print_acked_bytes_us >= 1000000) {
				_print_acked_bytes_us = _clock->Now().ToDebuggingValue();
				char buf[256] = { 0 };
				float speed = _total_acked_bytes - _prior_total_acked_bytes;
				speed = speed / 1024.0 / 1024.0;
#ifdef OUTPUT_DEBUG_INFO
				dd::OutputDebugInfo("%llu acked: %f Mbyte/s, acked_rate = %llu\r\n", _print_acked_bytes_us, speed, _acked_rate);
#endif
				_prior_total_acked_bytes = _total_acked_bytes;
			}
			return _repeating_task_interval_ms;
		});
	});
}